

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O3

void Dtt_PrintMulti2(Dtt_Man_t *p)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  
  uVar2 = 0;
  do {
    printf("n=%d : ",(ulong)uVar2);
    iVar1 = p->nClasses;
    if (0 < iVar1) {
      lVar3 = 0;
      do {
        if (p->pNodes[lVar3] == uVar2) {
          printf("%d ",(ulong)(uint)p->pTimes[lVar3]);
          iVar1 = p->nClasses;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < iVar1);
    }
    putchar(10);
    uVar2 = uVar2 + 1;
  } while (uVar2 != 8);
  return;
}

Assistant:

void Dtt_PrintMulti2( Dtt_Man_t * p )
{
    int i, n;
    for ( n = 0; n <= 7; n++ )
    {
        printf( "n=%d : ", n);
        for ( i = 0; i < p->nClasses; i++ )
            if ( p->pNodes[i] == n )
                printf( "%d ", p->pTimes[i] );
        printf( "\n" );
    }
}